

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::become_leader(raft_server *this)

{
  element_type *peVar1;
  __int_type_conflict _Var2;
  __int_type_conflict _Var3;
  _Hash_node_base *p_Var4;
  peer *pp;
  element_type *peVar5;
  context *pcVar6;
  int iVar7;
  int iVar8;
  int32 iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  buffer *pbVar10;
  size_t sVar11;
  undefined4 extraout_var_03;
  long lVar12;
  undefined4 extraout_var_04;
  undefined8 uVar13;
  ulong uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  Param param;
  ulong my_term;
  ptr<log_entry> entry;
  ptr<buffer> conf_buf;
  ptr<raft_params> params;
  undefined1 local_c8 [52];
  __int_type_conflict1 _Stack_94;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  cluster_config *local_88;
  undefined1 local_80 [24];
  ptr<log_entry> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _List_node_base *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  
  stop_election_timer(this);
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && (iVar7 = (*peVar1->_vptr_logger[7])(), 3 < iVar7)) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)local_c8,"number of pending commit elements: %zu",
               (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    (*peVar1->_vptr_logger[8])
              (peVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"become_leader",0x3dd,local_c8);
    if ((buffer *)local_c8._0_8_ != (buffer *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
  context::get_params((context *)&stack0xffffffffffffffb8);
  local_80._16_8_ = &this->cli_lock_;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)local_80._16_8_);
  if (iVar7 == 0) {
    LOCK();
    (this->role_)._M_i = leader;
    UNLOCK();
    LOCK();
    (this->leader_).super___atomic_base<int>._M_i = this->id_;
    UNLOCK();
    p_Var15 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    }
    timer_helper::set_duration_us
              (&this->leadership_transfer_timer_,
               (long)*(int *)((long)&local_48[4]._M_next + 4) * 1000);
    timer_helper::reset(&this->leadership_transfer_timer_);
    iVar7 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    LOCK();
    (this->precommit_index_).super___atomic_base<unsigned_long>._M_i =
         CONCAT44(extraout_var,iVar7) - 1;
    UNLOCK();
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar7 = (*peVar1->_vptr_logger[7])(), 3 < iVar7)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var2 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
      _Var3 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                ((string *)local_c8,
                 "state machine commit index %lu, precommit index %lu, last log index %lu",_Var2,
                 _Var3,CONCAT44(extraout_var_00,iVar7) + -1);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x3ed,local_c8);
      if ((buffer *)local_c8._0_8_ != (buffer *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    for (p_Var4 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
        p_Var4 = p_Var4->_M_nxt) {
      pp = (peer *)p_Var4[2]._M_nxt;
      p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[3]._M_nxt;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        }
      }
      clear_snapshot_sync_ctx(this,pp);
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      LOCK();
      (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i = CONCAT44(extraout_var_01,iVar7);
      UNLOCK();
      enable_hb_for_peer(this,pp);
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
    }
    get_config((raft_server *)(local_c8 + 0x30));
    _Var2 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
    iVar7 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    uVar14 = _Var2 + 1;
    uVar13 = stack0xffffffffffffff68;
    p_Var15 = local_90;
    if (uVar14 < CONCAT44(extraout_var_02,iVar7)) {
      do {
        peVar5 = (this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar5->_vptr_log_store[10])(local_80,peVar5,uVar14);
        p_Var16 = p_Var15;
        if (*(log_val_type *)(local_80._0_8_ + 8) == conf) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 3 < iVar8))
          {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            pbVar10 = log_entry::get_buf((log_entry *)local_80._0_8_);
            sVar11 = buffer::size(pbVar10);
            msg_if_given_abi_cxx11_
                      ((string *)local_c8,"found uncommitted config at %lu, size %zu",uVar14,sVar11)
            ;
            (*peVar1->_vptr_logger[8])
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"become_leader",0x405,local_c8);
            if ((buffer *)local_c8._0_8_ != (buffer *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
          }
          pbVar10 = log_entry::get_buf((log_entry *)local_80._0_8_);
          cluster_config::deserialize((cluster_config *)local_c8,pbVar10);
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
          uVar13 = local_c8._0_8_;
          local_c8._0_8_ = (buffer *)0x0;
          local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
        }
        uVar14 = uVar14 + 1;
        p_Var15 = p_Var16;
        local_90 = p_Var16;
      } while (CONCAT44(extraout_var_02,iVar7) != uVar14);
    }
    unique0x10000f6b = uVar13;
    cluster_config::serialize((cluster_config *)local_c8);
    cluster_config::deserialize((cluster_config *)local_80,(buffer *)local_c8._0_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    iVar7 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    *(ulong *)(local_80._0_8_ + 8) = *(ulong *)local_80._0_8_;
    *(ulong *)local_80._0_8_ = CONCAT44(extraout_var_03,iVar7);
    cluster_config::serialize((cluster_config *)&local_58);
    local_c8._0_8_ =
         (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->term_).super___atomic_base<unsigned_long>._M_i;
    local_c8[0x2e] = '\x02';
    lVar12 = std::chrono::_V2::system_clock::now();
    local_38 = (element_type *)(lVar12 / 1000);
    local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              (&local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(log_entry **)&local_68,
               (allocator<nuraft::log_entry> *)(local_c8 + 0x2f),(unsigned_long *)local_c8,
               (shared_ptr<nuraft::buffer> *)&local_58,local_c8 + 0x2e,
               (unsigned_long *)&stack0xffffffffffffffc8);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar7 = (*peVar1->_vptr_logger[7])(), 3 < iVar7)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                ((string *)local_c8,"[BECOME LEADER] appended new config at %lu",
                 CONCAT44(extraout_var_04,iVar7));
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x414,local_c8);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_);
      }
    }
    store_log_entry(this,&local_68,0);
    this->config_changing_ = true;
    if (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    pthread_mutex_unlock((pthread_mutex_t *)local_80._16_8_);
    _Stack_94 = (this->leader_).super___atomic_base<int>._M_i;
    local_c8._48_4_ = this->id_;
    local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_90._4_4_,0xffffffff);
    local_80._0_8_ =
         (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->term_).super___atomic_base<unsigned_long>._M_i;
    pcVar6 = (this->ctx_)._M_t.
             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
             super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
    local_88 = (cluster_config *)local_80;
    if ((pcVar6->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_58._M_allocated_capacity._0_4_ = 6;
      local_c8._0_8_ = local_c8 + 0x30;
      (*(pcVar6->cb_func_).func._M_invoker)
                ((_Any_data *)&pcVar6->cb_func_,(Type *)&local_58._M_allocated_capacity,
                 (Param **)local_c8);
    }
    LOCK();
    (this->write_paused_)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->next_leader_candidate_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    LOCK();
    (this->initialized_)._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (this->pre_vote_).quorum_reject_count_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->data_fresh_)._M_base._M_i = true;
    UNLOCK();
    request_append_entries(this);
    if ((this->my_priority_ == 0) && (iVar9 = get_num_voting_members(this), 1 < iVar9)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar7 = (*peVar1->_vptr_logger[7])(), 3 < iVar7)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_c8,"[BECOME LEADER] my priority is 0, will resign shortly");
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"become_leader",0x42b,local_c8);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_);
        }
      }
      yield_leadership(this,false,-1);
    }
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    }
    return;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

void raft_server::become_leader() {
    stop_election_timer();

    {   auto_lock(commit_ret_elems_lock_);
        p_in("number of pending commit elements: %zu",
             commit_ret_elems_.size());
    }

    ptr<raft_params> params = ctx_->get_params();
    {   auto_lock(cli_lock_);
        role_ = srv_role::leader;
        leader_ = id_;
        srv_to_join_.reset();
        leadership_transfer_timer_.set_duration_ms
            (params->leadership_transfer_min_wait_time_);
        leadership_transfer_timer_.reset();
        precommit_index_ = log_store_->next_slot() - 1;
        p_in("state machine commit index %" PRIu64 ", "
             "precommit index %" PRIu64 ", last log index %" PRIu64,
             sm_commit_index_.load(),
             precommit_index_.load(),
             log_store_->next_slot() - 1);
        ptr<snapshot> nil_snp;
        for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
            ptr<peer> pp = it->second;
            clear_snapshot_sync_ctx(*pp);
            // Reset RPC client for all peers.
            // NOTE: Now we don't reset client, as we already did it
            //       during pre-vote phase.
            // reconnect_client(*pp);

            pp->set_next_log_idx(log_store_->next_slot());
            enable_hb_for_peer(*pp);
        }

        // If there are uncommitted logs, search if conf log exists.
        ptr<cluster_config> last_config = get_config();

        ulong s_idx = sm_commit_index_ + 1;
        ulong e_idx = log_store_->next_slot();
        for (ulong ii = s_idx; ii < e_idx; ++ii) {
            ptr<log_entry> le = log_store_->entry_at(ii);
            if (le->get_val_type() != log_val_type::conf) continue;

            p_in("found uncommitted config at %" PRIu64 ", size %zu",
                 ii, le->get_buf().size());
            last_config = cluster_config::deserialize(le->get_buf());
        }

        // WARNING: WE SHOULD NOT CHANGE THE ORIGINAL CONTENTS DIRECTLY!
        ptr<cluster_config> last_config_cloned =
            cluster_config::deserialize( *last_config->serialize() );
        last_config_cloned->set_log_idx(log_store_->next_slot());
        ptr<buffer> conf_buf = last_config_cloned->serialize();
        ptr<log_entry> entry
            ( cs_new<log_entry>
              ( state_->get_term(),
                conf_buf,
                log_val_type::conf,
                timer_helper::get_timeofday_us() ) );
        p_in("[BECOME LEADER] appended new config at %" PRIu64, log_store_->next_slot());
        store_log_entry(entry);
        config_changing_ = true;
    }

    cb_func::Param param(id_, leader_);
    ulong my_term = state_->get_term();
    param.ctx = &my_term;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::BecomeLeader, &param);
    (void)rc; // nothing to do in this callback.

    write_paused_ = false;
    next_leader_candidate_ = -1;
    initialized_ = true;
    pre_vote_.quorum_reject_count_ = 0;
    pre_vote_.failure_count_ = 0;
    data_fresh_ = true;

    request_append_entries();

    if (my_priority_ == 0 && get_num_voting_members() > 1) {
        // If this member's priority is zero, this node owns a temporary
        // leadership. Let other node takeover shortly.
        p_in("[BECOME LEADER] my priority is 0, will resign shortly");
        yield_leadership();
    }
}